

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O2

void left_side(int row,int left_mark,int right,char *limits)

{
  char *pcVar1;
  bool bVar2;
  uint x2;
  int iVar3;
  uint row_00;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  uint x2_00;
  uint uVar12;
  int iVar13;
  char *local_90;
  ulong local_88;
  char *local_78;
  char *local_58;
  
  row_00 = step + row;
  if (row_00 < 0x15) {
    if (limits == (char *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = limits[1] <= *limits;
    }
  }
  else {
    bVar2 = false;
  }
  local_88 = 0;
  if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
    pcVar9 = cs_rows[row];
    local_90 = cs_left + row;
    local_78 = cs_right + row;
  }
  else {
    pcVar9 = (char *)0x0;
    local_90 = (char *)0x0;
    local_78 = (char *)0x0;
  }
  if (limits == (char *)0x0) {
    local_58 = (char *)0x0;
  }
  else {
    uVar7 = 0;
    if (0 < start_col - *limits) {
      uVar7 = start_col - *limits;
    }
    local_88 = (ulong)uVar7;
    if (left_mark < (int)uVar7) {
      left_mark = uVar7;
    }
    local_58 = limits + 1;
  }
LAB_0026e3a9:
  iVar3 = step;
  iVar13 = start_row;
  iVar10 = start_col;
  if (left_mark <= right) {
    lVar5 = (long)right;
    uVar7 = (uint)local_88;
    uVar11 = (ulong)(uint)(int)left_ptrs[row][lVar5];
    if ((int)left_ptrs[row][lVar5] < (int)uVar7) {
      uVar11 = local_88;
    }
    pcVar1 = viz_clear_rows[row];
    uVar12 = (uint)uVar11;
    if (pcVar1[lVar5] == '\0') {
      if ((int)uVar12 < left_mark) {
        uVar11 = (ulong)((left_mark - 1U) +
                        (uint)(viz_clear_rows[(long)row - (long)step][left_mark] == '\0'));
      }
      iVar10 = (int)uVar11;
      if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
        for (lVar8 = (long)iVar10; lVar8 <= lVar5; lVar8 = lVar8 + 1) {
          pcVar9[lVar8] = '\x01';
        }
        if (iVar10 < *local_90) {
          *local_90 = (char)uVar11;
        }
        if (*local_78 < right) {
          *local_78 = (char)right;
        }
      }
      else {
        while (iVar13 = (int)uVar11, iVar13 <= right) {
          (*vis_func)(iVar13,row,varg);
          uVar11 = (ulong)(iVar13 + 1);
        }
      }
      goto LAB_0026e60f;
    }
    x2_00 = right;
    if (right == start_col) goto LAB_0026e4ce;
    for (; (int)uVar12 <= (int)x2_00; x2_00 = x2_00 - 1) {
      if (iVar3 < 0) {
        iVar4 = q2_path(iVar13,iVar10,row,x2_00);
      }
      else {
        iVar4 = q3_path(iVar13,iVar10,row,x2_00);
      }
      if (iVar4 != 0) break;
    }
    if ((int)uVar7 <= (int)x2_00) {
      if (x2_00 != uVar7) goto code_r0x0026e4c2;
      if (vis_func != (_func_void_int_int_void_ptr *)0x0) {
        (*vis_func)(uVar7,row,varg);
        return;
      }
      pcVar9[local_88] = '\x01';
      if ((int)uVar7 < (int)*local_90) {
        *local_90 = (char)local_88;
      }
    }
  }
  return;
code_r0x0026e4c2:
  right = uVar12;
  if ((int)uVar12 < (int)x2_00) {
LAB_0026e4ce:
    iVar3 = step;
    iVar13 = start_row;
    x2 = left_mark;
    if ((int)uVar12 < left_mark) {
      for (; (int)uVar12 <= (int)x2; x2 = x2 - 1) {
        if (iVar3 < 0) {
          iVar4 = q2_path(iVar13,iVar10,row,x2);
        }
        else {
          iVar4 = q3_path(iVar13,iVar10,row,x2);
        }
        if (iVar4 == 0) break;
      }
      uVar12 = x2 + 1;
    }
    right = x2_00;
    if ((int)uVar12 <= (int)x2_00) {
      if ((((uVar12 == x2_00) && (uVar12 = x2_00, 0 < iVar10)) && (x2_00 == iVar10)) &&
         (uVar12 = iVar10, pcVar1[iVar10 - 1U] == '\0')) {
        uVar12 = iVar10 - 1U;
      }
      uVar11 = (ulong)uVar12;
      if ((int)uVar12 <= (int)uVar7) {
        uVar11 = local_88;
      }
      iVar10 = (int)uVar11;
      if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
        for (uVar6 = uVar11; (long)uVar6 <= (long)(int)x2_00; uVar6 = uVar6 + 1) {
          pcVar9[uVar6] = '\x01';
        }
        if (iVar10 < *local_90) {
          *local_90 = (char)uVar11;
        }
        if ((int)*local_78 < (int)x2_00) {
          *local_78 = (char)x2_00;
        }
      }
      else {
        while (iVar13 = (int)uVar11, iVar13 <= (int)x2_00) {
          (*vis_func)(iVar13,row,varg);
          uVar11 = (ulong)(iVar13 + 1);
        }
      }
      if (bVar2) {
        left_side(row_00,iVar10,x2_00,local_58);
      }
LAB_0026e60f:
      right = iVar10 - 1;
    }
  }
  goto LAB_0026e3a9;
}

Assistant:

static void left_side(int row, int left_mark, int right, const char *limits)
{
    int		  left, left_edge, nrow, deeper, result;
    int  i;
    char *rowp;
    char	  *row_min, *row_max;
    int		  lim_min;

    rowp = row_min = row_max = 0;
    nrow    = row+step;
    deeper  = good_row(nrow) && (!limits || (*limits >= *(limits+1)));
    if (!vis_func) {
	rowp    = cs_rows[row];
	row_min = &cs_left[row];
	row_max = &cs_right[row];
    }
    if (limits) {
	lim_min = start_col - *limits;
	if (lim_min < 0) lim_min = 0;
	if (left_mark < lim_min) left_mark = lim_min;
	limits++; /* prepare for next row */
    } else
	lim_min = 0;

    while (right >= left_mark) {
	left_edge = left_ptrs[row][right];
	if (left_edge < lim_min) left_edge = lim_min;

	if (!is_clear(row,right)) {
	    /* Jump to the far side of a stone wall. */
	    if (left_edge < left_mark) {
		/* Maybe see more (kludge). */
		left_edge = is_clear(row-step,left_mark) ?
						    left_mark-1 : left_mark;
	    }
	    if (vis_func) {
		for (i = left_edge; i <= right; i++) (*vis_func)(i, row, varg);
	    } else {
		for (i = left_edge; i <= right; i++) set_cs(rowp,i);
		set_min(left_edge); set_max(right);
	    }
	    right = left_edge - 1; /* no limit check necessary */
	    continue;
	}

	if (right != start_col) {
	    /* Find the right side. */
	    for (; right >= left_edge; right--) {
		if (step < 0) {
		    result = q2_path(start_row,start_col,row,right);
		} else {
		    result = q3_path(start_row,start_col,row,right);
		}
		if (result) break;
	    }

	    /* Check for boundary conditions. */
	    if (right < lim_min) return;
	    if (right == lim_min) {
		if (vis_func) (*vis_func)(lim_min, row, varg);
		else {
		    set_cs(rowp,lim_min);
		    set_min(lim_min);
		}
		return;
	    }
	    /* Check if we can see any spots in the opening. */
	    if (right <= left_edge) {
		right = left_edge;
		continue;
	    }
	}

	/* Find the left side. */
	if (left_mark > left_edge) {
	    for (left = left_mark; left >= left_edge; --left) {
		if (step < 0) {
		    result = q2_path(start_row,start_col,row,left);
		} else {
		    result = q3_path(start_row,start_col,row,left);
		}
		if (!result) break;
	    }
	    left++;	/* get rid of the last decrement */
	}
	else
	    left = left_edge;

	if (left <= right) {
	    /* An ugly special case. */
	    if (left == right && right == start_col &&
			    start_col > 0 && !is_clear(row,start_col-1))
		left = start_col-1;

	    if (left < lim_min) left = lim_min;
	    if (vis_func)
		for (i = left; i <= right; i++) (*vis_func)(i, row, varg);
	    else {
		for (i = left; i <= right; i++) set_cs(rowp,i);
		set_min(left);      set_max(right);
	    }

	    /* Recurse */
	    if (deeper) left_side(nrow,left,right,limits);
	    right = left - 1; /* no limit check necessary */
	}
    }
}